

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O0

DecodeStatus DecodeLogicalImmInstruction(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  _Bool _Var1;
  uint32_t regSize;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint64_t in_RCX;
  undefined8 in_RDX;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint imm;
  uint Datasize;
  uint Rn;
  uint Rd;
  uint local_38;
  uint RegNo;
  undefined4 in_stack_ffffffffffffffe8;
  
  RegNo = (uint)((ulong)in_RDX >> 0x20);
  regSize = fieldFromInstruction(in_ESI,0,5);
  uVar2 = fieldFromInstruction(in_ESI,5,5);
  uVar3 = fieldFromInstruction(in_ESI,0x1f,1);
  if (uVar3 == 0) {
    uVar4 = MCInst_getOpcode(in_RDI);
    if (uVar4 == 0x57) {
      DecodeGPR32RegisterClass
                ((MCInst *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),RegNo,in_RCX,
                 (void *)CONCAT44(regSize,uVar2));
    }
    else {
      DecodeGPR32spRegisterClass
                ((MCInst *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),RegNo,in_RCX,
                 (void *)CONCAT44(regSize,uVar2));
    }
    DecodeGPR32RegisterClass
              ((MCInst *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),RegNo,in_RCX,
               (void *)CONCAT44(regSize,uVar2));
    local_38 = fieldFromInstruction(in_ESI,10,0xc);
    _Var1 = AArch64_AM_isValidDecodeLogicalImmediate(in_RCX,regSize);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  else {
    uVar4 = MCInst_getOpcode(in_RDI);
    if (uVar4 == 0x5a) {
      DecodeGPR64RegisterClass
                ((MCInst *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),RegNo,in_RCX,
                 (void *)CONCAT44(regSize,uVar2));
    }
    else {
      DecodeGPR64spRegisterClass
                ((MCInst *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),RegNo,in_RCX,
                 (void *)CONCAT44(regSize,uVar2));
    }
    DecodeGPR64RegisterClass
              ((MCInst *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),RegNo,in_RCX,
               (void *)CONCAT44(regSize,uVar2));
    local_38 = fieldFromInstruction(in_ESI,10,0xd);
    _Var1 = AArch64_AM_isValidDecodeLogicalImmediate(in_RCX,regSize);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  MCOperand_CreateImm0(in_RDI,(ulong)local_38);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeLogicalImmInstruction(MCInst *Inst,
		uint32_t insn, uint64_t Addr,
		const void *Decoder)
{
	unsigned Rd = fieldFromInstruction(insn, 0, 5);
	unsigned Rn = fieldFromInstruction(insn, 5, 5);
	unsigned Datasize = fieldFromInstruction(insn, 31, 1);
	unsigned imm;

	if (Datasize) {
		if (MCInst_getOpcode(Inst) == AArch64_ANDSXri)
			DecodeGPR64RegisterClass(Inst, Rd, Addr, Decoder);
		else
			DecodeGPR64spRegisterClass(Inst, Rd, Addr, Decoder);
		DecodeGPR64RegisterClass(Inst, Rn, Addr, Decoder);
		imm = fieldFromInstruction(insn, 10, 13);
		if (!AArch64_AM_isValidDecodeLogicalImmediate(imm, 64))
			return Fail;
	} else {
		if (MCInst_getOpcode(Inst) == AArch64_ANDSWri)
			DecodeGPR32RegisterClass(Inst, Rd, Addr, Decoder);
		else
			DecodeGPR32spRegisterClass(Inst, Rd, Addr, Decoder);
		DecodeGPR32RegisterClass(Inst, Rn, Addr, Decoder);
		imm = fieldFromInstruction(insn, 10, 12);
		if (!AArch64_AM_isValidDecodeLogicalImmediate(imm, 32))
			return Fail;
	}

	MCOperand_CreateImm0(Inst, imm);
	return Success;
}